

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall
ON_Xform::GetKMLOrientationAnglesDegrees
          (ON_Xform *this,double *heading_degrees,double *tilt_degrees,double *roll_degrees)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double roll_radians;
  double tilt_radians;
  double heading_radians;
  double local_48;
  double local_40;
  double local_38;
  
  local_38 = ON_DBL_QNAN;
  local_40 = ON_DBL_QNAN;
  local_48 = ON_DBL_QNAN;
  bVar1 = GetKMLOrientationAnglesRadians(this,&local_38,&local_40,&local_48);
  dVar3 = local_38 * 57.29577951308232;
  dVar4 = floor(dVar3);
  uVar2 = -(ulong)(0.5 < dVar3 - dVar4);
  dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)(dVar4 + 1.0) & uVar2);
  uVar2 = -(ulong)(ABS(dVar3 - dVar4) < 0.0001388888888888889);
  dVar3 = (double)(~uVar2 & (ulong)dVar3 | uVar2 & (ulong)dVar4);
  dVar3 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar3 |
                  (ulong)(dVar3 + 360.0) & -(ulong)(dVar3 < 0.0));
  *heading_degrees = (double)(~-(ulong)(ABS(dVar3) < 0.0001388888888888889) & (ulong)dVar3);
  dVar4 = local_40 * 57.29577951308232;
  dVar3 = floor(dVar4);
  uVar2 = -(ulong)(0.5 < dVar4 - dVar3);
  dVar3 = (double)(~uVar2 & (ulong)dVar3 | (ulong)(dVar3 + 1.0) & uVar2);
  uVar2 = -(ulong)(ABS(dVar4 - dVar3) < 0.0001388888888888889);
  dVar3 = (double)(~uVar2 & (ulong)dVar4 | uVar2 & (ulong)dVar3);
  dVar3 = (double)(~-(ulong)(dVar3 < -180.0) & (ulong)dVar3 |
                  (ulong)(dVar3 + 360.0) & -(ulong)(dVar3 < -180.0));
  *tilt_degrees = (double)(~-(ulong)(ABS(dVar3) < 0.0001388888888888889) & (ulong)dVar3);
  dVar3 = local_48 * 57.29577951308232;
  dVar4 = floor(dVar3);
  uVar2 = -(ulong)(0.5 < dVar3 - dVar4);
  dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)(dVar4 + 1.0) & uVar2);
  uVar2 = -(ulong)(ABS(dVar3 - dVar4) < 0.0001388888888888889);
  dVar3 = (double)(~uVar2 & (ulong)dVar3 | uVar2 & (ulong)dVar4);
  dVar3 = (double)(~-(ulong)(dVar3 < -180.0) & (ulong)dVar3 |
                  (ulong)(dVar3 + 360.0) & -(ulong)(dVar3 < -180.0));
  *roll_degrees = (double)(~-(ulong)(ABS(dVar3) < 0.0001388888888888889) & (ulong)dVar3);
  return bVar1;
}

Assistant:

bool ON_Xform::GetKMLOrientationAnglesDegrees(double& heading_degrees, double& tilt_degrees, double& roll_degrees) const
{
  double heading_radians = ON_DBL_QNAN;
  double tilt_radians = ON_DBL_QNAN;
  double roll_radians = ON_DBL_QNAN;
  const bool rc = ON_Xform::GetKMLOrientationAnglesRadians(heading_radians, tilt_radians, roll_radians);
  heading_degrees = Internal_RadiansToPrettyKMLDegrees(heading_radians, 0.0);
  tilt_degrees = Internal_RadiansToPrettyKMLDegrees(tilt_radians, -180.0);
  roll_degrees = Internal_RadiansToPrettyKMLDegrees(roll_radians, -180.0);
  return rc;
}